

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initBound(HModel *this,int phase)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar6 = 0;
  initPh2ColBound(this,0,this->numCol + -1);
  initPh2RowBound(this,0,this->numRow + -1);
  if (phase != 2) {
    pdVar2 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = this->numCol;
    pdVar4 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (ulong)(uint)this->numTot;
    if (this->numTot < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar7 = pdVar3[uVar6];
      if ((pdVar2[uVar6] != -1e+200) || (NAN(pdVar2[uVar6]))) {
        pdVar2[uVar6] = 0.0;
        dVar7 = (double)(-(ulong)(dVar7 == 1e+200) & 0x3ff0000000000000);
LAB_0012e5b7:
        pdVar3[uVar6] = dVar7;
        pdVar4[uVar6] = dVar7 - pdVar2[uVar6];
      }
      else {
        if ((dVar7 != 1e+200) || (NAN(dVar7))) {
          pdVar2[uVar6] = -1.0;
          dVar7 = 0.0;
          goto LAB_0012e5b7;
        }
        if ((long)uVar6 < (long)iVar1) {
          pdVar2[uVar6] = -1000.0;
          dVar7 = 1000.0;
          goto LAB_0012e5b7;
        }
      }
    }
  }
  return;
}

Assistant:

void HModel::initBound(int phase) {
  // Initialise the Phase 2 bounds (and ranges). NB Phase 2 bounds
  // necessary to compute Phase 1 bounds
  initPh2ColBound(0, numCol-1);
  initPh2RowBound(0, numRow-1);
  if (phase == 2) return;

  // In Phase 1: change to dual phase 1 bound
  const double inf = HSOL_CONST_INF;
  for (int i = 0; i < numTot; i++) {
    if (workLower[i] == -inf && workUpper[i] == inf) {
      // Won't change for row variables: they should never become
      // non basic
      if (i >= numCol) continue;
      workLower[i] = -1000, workUpper[i] = 1000;  // FREE
    } else if (workLower[i] == -inf) {
      workLower[i] = -1, workUpper[i] = 0;        // UPPER
    } else if (workUpper[i] == inf) {
      workLower[i] = 0, workUpper[i] = 1;         // LOWER
    } else {
      workLower[i] = 0, workUpper[i] = 0;         // BOXED or FIXED
    }
    workRange[i] = workUpper[i] - workLower[i];
  }
}